

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_stream::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_stream *this,endpoint_type *param_1,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  pointer __s;
  function<void_(const_boost::system::error_code_&)> local_148;
  i2p_stream *local_128;
  code *local_120;
  undefined8 local_118;
  type local_110;
  allocator<char> local_c7;
  array<char,_22UL> local_c6;
  string local_b0;
  undefined1 local_90 [8];
  query q;
  _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *handler_local;
  endpoint_type *param_1_local;
  i2p_stream *this_local;
  
  q.service_name_.field_2._8_8_ = handler;
  to_string(&local_c6,(long)(this->super_proxy_base).m_port);
  __s = std::array<char,_22UL>::data(&local_c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_c7);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_90,
             &(this->super_proxy_base).m_hostname,&local_b0,address_configured);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_c7);
  local_120 = do_connect;
  local_118 = 0;
  local_128 = this;
  std::function<void(boost::system::error_code_const&)>::
  function<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const,void>
            ((function<void(boost::system::error_code_const&)> *)&local_148,
             (_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)q.service_name_.field_2._8_8_);
  std::
  bind<void(libtorrent::i2p_stream::*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>),libtorrent::i2p_stream*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::function<void(boost::system::error_code_const&)>>
            (&local_110,(offset_in_i2p_stream_to_subr *)&local_120,&local_128,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             &local_148);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<std::_Bind<void(libtorrent::i2p_stream::*(libtorrent::i2p_stream*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>)>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&(this->super_proxy_base).m_resolver,(query *)local_90,&local_110);
  std::
  _Bind<void_(libtorrent::i2p_stream::*(libtorrent::i2p_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::function<void_(const_boost::system::error_code_&)>)>
  ::~_Bind(&local_110);
  std::function<void_(const_boost::system::error_code_&)>::~function(&local_148);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_90);
  return;
}

Assistant:

void async_connect(endpoint_type const&, Handler const& handler)
	{
		// since we don't support regular endpoints, just ignore the one
		// provided and use m_dest.

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to SAM bridge
		// 4 send command message (CONNECT/ACCEPT)

		using std::placeholders::_1;
		using std::placeholders::_2;
		tcp::resolver::query q(m_hostname, to_string(m_port).data());
		m_resolver.async_resolve(q, std::bind(
			&i2p_stream::do_connect, this, _1, _2, handler_type(std::move(handler))));
	}